

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,mt19937 *R)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  long lVar3;
  parameter_type P_new;
  status_type S_new;
  delim_c local_a05;
  delim_c local_a04;
  delim_c local_a03;
  delim_c local_a02;
  parameter_type local_a01;
  delim_str local_a00;
  status_type local_9f4;
  
  memset(&local_9f4,0,0x9c4);
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  utility::operator>>(in,(ignore_spaces_cl *)&local_a00);
  local_a02.c = '[';
  pbVar2 = utility::operator>>(in,&local_a02);
  local_a00.str = mt19937::name();
  pbVar2 = utility::operator>>(pbVar2,&local_a00);
  local_a03.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_a03);
  pbVar2 = operator>>(pbVar2,&local_a01);
  local_a04.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_a04);
  pbVar2 = operator>>(pbVar2,&local_9f4);
  local_a05.c = ']';
  utility::operator>>(pbVar2,&local_a05);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar3 + 0x20] & 5) == 0) {
    memcpy(&R->S,&local_9f4,0x9c4);
    lVar3 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar3 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mt19937 &R) {
      mt19937::parameter_type P_new;
      mt19937::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(mt19937::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }